

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitrate.c
# Opt level: O3

int vorbis_bitrate_addblock(vorbis_block *vb)

{
  void *pvVar1;
  vorbis_info *pvVar2;
  void *pvVar3;
  void *pvVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  undefined8 *puVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  long local_88;
  long local_68;
  int local_38;
  
  pvVar1 = vb->internal;
  pvVar2 = vb->vd->vi;
  pvVar3 = vb->vd->backend_state;
  pvVar4 = pvVar2->codec_setup;
  dVar20 = rint(*(double *)((long)pvVar3 + 200));
  uVar12 = (uint)dVar20;
  uVar8 = (ulong)uVar12;
  lVar6 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + (long)(int)uVar12 * 8 + 0x10));
  lVar7 = vb->W;
  lVar14 = *(long *)((long)pvVar3 + 0xb0);
  if (lVar7 == 0) {
    local_68 = *(long *)((long)pvVar3 + 0xb8);
    local_88 = lVar14;
  }
  else {
    local_68 = *(long *)((long)pvVar3 + 0xc0) * *(long *)((long)pvVar3 + 0xb8);
    local_88 = *(long *)((long)pvVar3 + 0xc0) * lVar14;
  }
  if (*(int *)((long)pvVar3 + 0x90) == 0) {
    if (*(long *)((long)pvVar3 + 0xd0) != 0) {
      return -1;
    }
    *(vorbis_block **)((long)pvVar3 + 0xd0) = vb;
    return 0;
  }
  puVar9 = (undefined8 *)((long)pvVar1 + 0x10);
  lVar6 = lVar6 * 8;
  lVar10 = (long)((double)*(long *)((long)pvVar4 + 0x1558) * *(double *)((long)pvVar4 + 0x1560));
  uVar16 = *(ulong *)((long)pvVar4 + lVar7 * 8);
  *(vorbis_block **)((long)pvVar3 + 0xd0) = vb;
  lVar15 = *(long *)((long)pvVar3 + 0xa8);
  if (0 < lVar15) {
    if (lVar7 != 0) {
      lVar15 = lVar15 * *(long *)((long)pvVar3 + 0xc0);
    }
    dVar20 = 15.0 / *(double *)((long)pvVar4 + 0x1568);
    lVar7 = (lVar6 - lVar15) + *(long *)((long)pvVar3 + 0x98);
    if (lVar10 < lVar7) {
      if ((0 < (int)uVar12) && (lVar15 < lVar6)) {
        uVar11 = (ulong)uVar12;
        while (uVar8 = uVar11, lVar10 < (lVar6 - lVar15) + *(long *)((long)pvVar3 + 0x98)) {
          uVar8 = uVar11 - 1;
          lVar6 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + uVar11 * 8 + 8));
          if (((long)uVar11 < 2) || (lVar6 = lVar6 * 8, uVar11 = uVar8, lVar6 <= lVar15)) break;
        }
      }
    }
    else if ((lVar7 < lVar10) && (uVar11 = (long)(int)uVar12, (int)uVar12 < 0xe)) {
      for (; (lVar6 < lVar15 &&
             (uVar8 = uVar11, (lVar6 - lVar15) + *(long *)((long)pvVar3 + 0x98) < lVar10));
          lVar6 = lVar6 << 3) {
        uVar8 = uVar11 + 1;
        lVar6 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + uVar11 * 8 + 0x18));
        if (0xc < (long)uVar11) break;
        uVar11 = uVar8;
      }
    }
    dVar21 = *(double *)((long)pvVar3 + 200);
    dVar5 = rint((double)(int)uVar8 - dVar21);
    local_38 = (int)(uVar16 >> 1);
    dVar18 = (double)pvVar2->rate;
    dVar5 = (dVar5 / (double)local_38) * dVar18;
    dVar19 = -dVar20;
    if (-dVar20 <= dVar5) {
      dVar19 = dVar5;
    }
    if (dVar19 <= dVar20) {
      dVar20 = dVar19;
    }
    dVar21 = (dVar20 / dVar18) * (double)local_38 + dVar21;
    *(double *)((long)pvVar3 + 200) = dVar21;
    dVar20 = rint(dVar21);
    uVar8 = (ulong)(uint)(int)dVar20;
    lVar6 = oggpack_bytes((oggpack_buffer *)puVar9[(int)dVar20]);
    lVar6 = lVar6 << 3;
    lVar14 = *(long *)((long)pvVar3 + 0xb0);
  }
  if (((0 < lVar14) && (lVar6 < local_88)) &&
     ((lVar6 - local_88) + *(long *)((long)pvVar3 + 0xa0) < 0)) {
    iVar13 = (int)uVar8;
    uVar16 = 0xe;
    if (0xe < iVar13) {
      uVar16 = uVar8;
    }
    uVar12 = (int)uVar16 + 1;
    if (iVar13 < 0xe) {
      lVar7 = 0;
      do {
        lVar6 = oggpack_bytes(*(oggpack_buffer **)
                               ((long)pvVar1 + lVar7 * 8 + (long)iVar13 * 8 + 0x18));
        lVar6 = lVar6 * 8;
        if (-1 < (lVar6 - local_88) + *(long *)((long)pvVar3 + 0xa0)) {
          uVar12 = iVar13 + (int)lVar7 + 1;
          break;
        }
        lVar7 = lVar7 + 1;
      } while (uVar16 - (long)iVar13 != lVar7);
      uVar8 = (ulong)uVar12;
    }
    else {
      uVar8 = (ulong)uVar12;
    }
  }
  uVar12 = (uint)uVar8;
  if ((*(long *)((long)pvVar3 + 0xb8) < 1) || (lVar6 - local_68 == 0 || lVar6 < local_68)) {
LAB_001da850:
    if ((int)uVar12 < 0) {
      lVar14 = *(long *)((long)pvVar4 + 0x1558);
      lVar7 = *(long *)((long)pvVar3 + 0xa0);
      goto LAB_001da8d2;
    }
    lVar14 = local_88 - *(long *)((long)pvVar3 + 0xa0);
    lVar7 = lVar14 + 7;
    lVar14 = lVar14 + 0xe;
    if (-1 < lVar7) {
      lVar14 = lVar7;
    }
    uVar8 = 0xe;
    if (uVar12 < 0xe) {
      uVar8 = (ulong)uVar12;
    }
    *(int *)((long)pvVar3 + 0xd8) = (int)uVar8;
    puVar9 = puVar9 + uVar8;
    lVar7 = oggpack_bytes((oggpack_buffer *)*puVar9);
    lVar6 = (lVar14 >> 3) - lVar7;
    if (lVar6 != 0 && lVar7 <= lVar14 >> 3) {
      uVar8 = lVar6 + 1;
      do {
        oggpack_write((oggpack_buffer *)*puVar9,0,8);
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
LAB_001da916:
    lVar6 = oggpack_bytes((oggpack_buffer *)*puVar9);
    lVar6 = lVar6 << 3;
  }
  else {
    lVar7 = *(long *)((long)pvVar3 + 0xa0);
    lVar14 = *(long *)((long)pvVar4 + 0x1558);
    if ((lVar6 - local_68) + lVar7 <= lVar14) goto LAB_001da850;
    if (0 < (int)uVar12) {
      puVar17 = (undefined8 *)((long)pvVar1 + uVar8 * 8 + 8);
      do {
        lVar6 = oggpack_bytes((oggpack_buffer *)*puVar17);
        lVar6 = lVar6 * 8;
        lVar7 = *(long *)((long)pvVar3 + 0xa0);
        lVar14 = *(long *)((long)pvVar4 + 0x1558);
        iVar13 = (int)uVar8;
        if ((lVar6 - local_68) + lVar7 <= lVar14) {
          uVar12 = iVar13 - 1;
          goto LAB_001da850;
        }
        puVar17 = puVar17 + -1;
        uVar8 = (ulong)(iVar13 - 1U);
      } while (iVar13 - 1U != 0 && 0 < iVar13);
    }
LAB_001da8d2:
    lVar7 = (lVar14 + local_68) - lVar7;
    lVar14 = lVar7 + 7;
    if (-1 < lVar7) {
      lVar14 = lVar7;
    }
    *(undefined4 *)((long)pvVar3 + 0xd8) = 0;
    lVar7 = oggpack_bytes((oggpack_buffer *)*puVar9);
    if (lVar14 >> 3 < lVar7) {
      oggpack_writetrunc((oggpack_buffer *)*puVar9,(lVar14 >> 3) << 3);
      goto LAB_001da916;
    }
  }
  if ((*(long *)((long)pvVar3 + 0xb0) < 1) && (*(long *)((long)pvVar3 + 0xb8) < 1))
  goto LAB_001da963;
  if (((0 < local_68) && (lVar7 = lVar6 - local_68, lVar7 != 0 && local_68 <= lVar6)) ||
     ((0 < local_88 && (lVar7 = lVar6 - local_88, lVar6 < local_88)))) {
    *(long *)((long)pvVar3 + 0xa0) = *(long *)((long)pvVar3 + 0xa0) + lVar7;
    goto LAB_001da963;
  }
  lVar7 = *(long *)((long)pvVar3 + 0xa0);
  if (lVar10 < lVar7) {
    if (local_68 < 1) {
LAB_001da9f1:
      *(long *)((long)pvVar3 + 0xa0) = lVar10;
      goto LAB_001da963;
    }
    lVar7 = (lVar6 - local_68) + lVar7;
    if (lVar7 <= lVar10) {
      lVar7 = lVar10;
    }
  }
  else {
    if (local_88 < 1) goto LAB_001da9f1;
    lVar7 = (lVar6 - local_88) + lVar7;
    if (lVar10 <= lVar7) {
      lVar7 = lVar10;
    }
  }
  *(long *)((long)pvVar3 + 0xa0) = lVar7;
LAB_001da963:
  lVar7 = *(long *)((long)pvVar3 + 0xa8);
  if (0 < lVar7) {
    if (vb->W != 0) {
      lVar7 = lVar7 * *(long *)((long)pvVar3 + 0xc0);
    }
    *(long *)((long)pvVar3 + 0x98) = *(long *)((long)pvVar3 + 0x98) + (lVar6 - lVar7);
  }
  return 0;
}

Assistant:

int vorbis_bitrate_addblock(vorbis_block *vb){
  vorbis_block_internal *vbi=vb->internal;
  vorbis_dsp_state      *vd=vb->vd;
  private_state         *b=vd->backend_state;
  bitrate_manager_state *bm=&b->bms;
  vorbis_info           *vi=vd->vi;
  codec_setup_info      *ci=vi->codec_setup;
  bitrate_manager_info  *bi=&ci->bi;

  int  choice=rint(bm->avgfloat);
  long this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
  long min_target_bits=(vb->W?bm->min_bitsper*bm->short_per_long:bm->min_bitsper);
  long max_target_bits=(vb->W?bm->max_bitsper*bm->short_per_long:bm->max_bitsper);
  int  samples=ci->blocksizes[vb->W]>>1;
  long desired_fill=bi->reservoir_bits*bi->reservoir_bias;
  if(!bm->managed){
    /* not a bitrate managed stream, but for API simplicity, we'll
       buffer the packet to keep the code path clean */

    if(bm->vb)return(-1); /* one has been submitted without
                             being claimed */
    bm->vb=vb;
    return(0);
  }

  bm->vb=vb;

  /* look ahead for avg floater */
  if(bm->avg_bitsper>0){
    double slew=0.;
    long avg_target_bits=(vb->W?bm->avg_bitsper*bm->short_per_long:bm->avg_bitsper);
    double slewlimit= 15./bi->slew_damp;

    /* choosing a new floater:
       if we're over target, we slew down
       if we're under target, we slew up

       choose slew as follows: look through packetblobs of this frame
       and set slew as the first in the appropriate direction that
       gives us the slew we want.  This may mean no slew if delta is
       already favorable.

       Then limit slew to slew max */

    if(bm->avg_reservoir+(this_bits-avg_target_bits)>desired_fill){
      while(choice>0 && this_bits>avg_target_bits &&
            bm->avg_reservoir+(this_bits-avg_target_bits)>desired_fill){
        choice--;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }else if(bm->avg_reservoir+(this_bits-avg_target_bits)<desired_fill){
      while(choice+1<PACKETBLOBS && this_bits<avg_target_bits &&
            bm->avg_reservoir+(this_bits-avg_target_bits)<desired_fill){
        choice++;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }

    slew=rint(choice-bm->avgfloat)/samples*vi->rate;
    if(slew<-slewlimit)slew=-slewlimit;
    if(slew>slewlimit)slew=slewlimit;
    choice=rint(bm->avgfloat+= slew/vi->rate*samples);
    this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
  }



  /* enforce min(if used) on the current floater (if used) */
  if(bm->min_bitsper>0){
    /* do we need to force the bitrate up? */
    if(this_bits<min_target_bits){
      while(bm->minmax_reservoir-(min_target_bits-this_bits)<0){
        choice++;
        if(choice>=PACKETBLOBS)break;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }
  }

  /* enforce max (if used) on the current floater (if used) */
  if(bm->max_bitsper>0){
    /* do we need to force the bitrate down? */
    if(this_bits>max_target_bits){
      while(bm->minmax_reservoir+(this_bits-max_target_bits)>bi->reservoir_bits){
        choice--;
        if(choice<0)break;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }
  }

  /* Choice of packetblobs now made based on floater, and min/max
     requirements. Now boundary check extreme choices */

  if(choice<0){
    /* choosing a smaller packetblob is insufficient to trim bitrate.
       frame will need to be truncated */
    long maxsize=(max_target_bits+(bi->reservoir_bits-bm->minmax_reservoir))/8;
    bm->choice=choice=0;

    if(oggpack_bytes(vbi->packetblob[choice])>maxsize){

      oggpack_writetrunc(vbi->packetblob[choice],maxsize*8);
      this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
    }
  }else{
    long minsize=(min_target_bits-bm->minmax_reservoir+7)/8;
    if(choice>=PACKETBLOBS)
      choice=PACKETBLOBS-1;

    bm->choice=choice;

    /* prop up bitrate according to demand. pad this frame out with zeroes */
    minsize-=oggpack_bytes(vbi->packetblob[choice]);
    while(minsize-->0)oggpack_write(vbi->packetblob[choice],0,8);
    this_bits=oggpack_bytes(vbi->packetblob[choice])*8;

  }

  /* now we have the final packet and the final packet size.  Update statistics */
  /* min and max reservoir */
  if(bm->min_bitsper>0 || bm->max_bitsper>0){

    if(max_target_bits>0 && this_bits>max_target_bits){
      bm->minmax_reservoir+=(this_bits-max_target_bits);
    }else if(min_target_bits>0 && this_bits<min_target_bits){
      bm->minmax_reservoir+=(this_bits-min_target_bits);
    }else{
      /* inbetween; we want to take reservoir toward but not past desired_fill */
      if(bm->minmax_reservoir>desired_fill){
        if(max_target_bits>0){ /* logical bulletproofing against initialization state */
          bm->minmax_reservoir+=(this_bits-max_target_bits);
          if(bm->minmax_reservoir<desired_fill)bm->minmax_reservoir=desired_fill;
        }else{
          bm->minmax_reservoir=desired_fill;
        }
      }else{
        if(min_target_bits>0){ /* logical bulletproofing against initialization state */
          bm->minmax_reservoir+=(this_bits-min_target_bits);
          if(bm->minmax_reservoir>desired_fill)bm->minmax_reservoir=desired_fill;
        }else{
          bm->minmax_reservoir=desired_fill;
        }
      }
    }
  }

  /* avg reservoir */
  if(bm->avg_bitsper>0){
    long avg_target_bits=(vb->W?bm->avg_bitsper*bm->short_per_long:bm->avg_bitsper);
    bm->avg_reservoir+=this_bits-avg_target_bits;
  }

  return(0);
}